

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDec16.c
# Opt level: O1

int If_CutPerformCheck16(If_Man_t *p,uint *pTruth0,int nVars,int nLeaves,char *pStr)

{
  If_Par_t *pIVar1;
  ulong uVar2;
  uint uVar3;
  uint uVar4;
  size_t sVar5;
  byte bVar6;
  byte bVar7;
  int iVar8;
  int nLutRoot;
  ulong uVar9;
  uint uVar10;
  ulong *puVar11;
  ulong *puVar12;
  ulong *puVar13;
  int iVar14;
  int nVars_00;
  long lVar15;
  int iVar16;
  int nLutLeaf;
  long lVar17;
  ulong uVar18;
  ulong *puVar19;
  ulong uVar20;
  ulong uVar21;
  long lVar22;
  ulong *puVar23;
  ulong *puVar24;
  ulong uVar25;
  word *pLimit;
  uint pTruth [1024];
  ulong local_10b0;
  If_Grp_t local_104a;
  ulong local_1038 [513];
  
  if (nVars < 6) {
    __assert_fail("nVars >= 6",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifDec16.c"
                  ,0x8ae,"int If_CutPerformCheck16(If_Man_t *, unsigned int *, int, int, char *)");
  }
  iVar8 = nVars + -6;
  uVar4 = 1 << ((byte)iVar8 & 0x1f);
  puVar24 = local_1038;
  memcpy(puVar24,pTruth0,(long)(int)uVar4 * 8);
  pIVar1 = p->pPars;
  iVar16 = pIVar1->nLutSize;
  if (iVar16 != nLeaves) {
    if (iVar16 <= nLeaves) {
      __assert_fail("nVarS < nVarB",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/utilTruth.h"
                    ,0x47d,"void Abc_TtStretch6(word *, int, int)");
    }
    uVar10 = 1 << ((char)nLeaves - 6U & 0x1f);
    if (nLeaves < 7) {
      uVar10 = 1;
    }
    uVar3 = 1 << ((char)iVar16 - 6U & 0x1f);
    if (iVar16 < 7) {
      uVar3 = 1;
    }
    if (uVar10 != uVar3) {
      if ((int)uVar3 <= (int)uVar10) {
        __assert_fail("step < nWords",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/utilTruth.h"
                      ,0x482,"void Abc_TtStretch6(word *, int, int)");
      }
      if (0 < (int)uVar3) {
        lVar17 = 0;
        do {
          if (0 < (int)uVar10) {
            uVar20 = 0;
            do {
              puVar24[uVar20] = local_1038[uVar20];
              uVar20 = uVar20 + 1;
            } while (uVar10 != uVar20);
          }
          lVar17 = lVar17 + (int)uVar10;
          puVar24 = puVar24 + (int)uVar10;
        } while (lVar17 < (long)(ulong)uVar3);
      }
    }
  }
  local_10b0 = (ulong)(uint)nLeaves;
  if (pIVar1->fCutMin == 0) {
    if (nVars < nLeaves) {
      __assert_fail("nVars <= nVarsAll",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/utilTruth.h"
                    ,0x75b,"int Abc_TtMinBase(word *, int *, int, int)");
    }
    if (nLeaves < 1) {
      local_10b0 = 0;
    }
    else {
      puVar24 = local_1038 + (int)uVar4;
      if ((int)uVar4 < 2) {
        uVar4 = 1;
      }
      uVar20 = 0;
      local_10b0 = 0;
      do {
        if (uVar20 == (uint)nVars) {
          __assert_fail("iVar < nVars",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/utilTruth.h"
                        ,0x582,"int Abc_TtHasVar(word *, int, int)");
        }
        bVar6 = (byte)uVar20;
        if (nVars == 6) {
          if ((s_Truths6Neg[uVar20] &
              (local_1038[0] >> ((byte)(1 << (bVar6 & 0x1f)) & 0x3f) ^ local_1038[0])) != 0) {
LAB_00414663:
            iVar16 = (int)local_10b0;
            lVar17 = (long)iVar16;
            if (lVar17 < (long)uVar20) {
              if ((uint)nVars <= uVar20) {
                __assert_fail("iVar < jVar && jVar < nVars",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/utilTruth.h"
                              ,0x692,"void Abc_TtSwapVars(word *, int, int, int)");
              }
              bVar7 = (byte)local_10b0;
              if (nVars == 6) {
                bVar6 = (char)(-1 << (bVar7 & 0x1f)) + (char)(1 << (bVar6 & 0x1f));
                local_1038[0] =
                     (local_1038[0] & *(ulong *)(lVar17 * 0x90 + 0x9ae280 + uVar20 * 0x18)) >>
                     (bVar6 & 0x3f) |
                     (*(ulong *)(lVar17 * 0x90 + 0x9ae278 + uVar20 * 0x18) & local_1038[0]) <<
                     (bVar6 & 0x3f) | s_PPMasks[lVar17][uVar20][0] & local_1038[0];
              }
              else if (uVar20 < 6) {
                if (iVar8 != 0x1f) {
                  bVar6 = (char)(1 << (bVar6 & 0x1f)) + (char)(-1 << (bVar7 & 0x1f));
                  uVar21 = s_PPMasks[lVar17][uVar20][0];
                  uVar9 = *(ulong *)(lVar17 * 0x90 + 0x9ae278 + uVar20 * 0x18);
                  uVar25 = *(ulong *)(lVar17 * 0x90 + 0x9ae280 + uVar20 * 0x18);
                  uVar18 = 0;
                  do {
                    uVar2 = local_1038[uVar18];
                    local_1038[uVar18] =
                         (uVar2 & uVar25) >> (bVar6 & 0x3f) |
                         (uVar2 & uVar9) << (bVar6 & 0x3f) | uVar2 & uVar21;
                    uVar18 = uVar18 + 1;
                  } while (uVar4 != uVar18);
                }
              }
              else if (iVar16 < 6) {
                if (iVar8 != 0x1f) {
                  bVar6 = (byte)(uVar20 - 6);
                  uVar10 = 1 << (bVar6 & 0x1f);
                  iVar14 = 2 << (bVar6 & 0x1f);
                  uVar21 = 1;
                  if (1 < (int)uVar10) {
                    uVar21 = (ulong)uVar10;
                  }
                  puVar12 = local_1038 + (int)uVar10;
                  puVar11 = local_1038;
                  do {
                    if (uVar20 - 6 != 0x1f) {
                      uVar9 = Truth6[lVar17];
                      uVar25 = 0;
                      do {
                        uVar18 = puVar11[uVar25];
                        bVar6 = (byte)(1 << (bVar7 & 0x1f));
                        uVar2 = puVar12[uVar25];
                        puVar11[uVar25] = uVar18 & ~uVar9 | uVar2 << (bVar6 & 0x3f) & uVar9;
                        puVar12[uVar25] = uVar2 & uVar9 | (uVar18 & uVar9) >> (bVar6 & 0x3f);
                        uVar25 = uVar25 + 1;
                      } while (uVar21 != uVar25);
                    }
                    puVar11 = puVar11 + iVar14;
                    puVar12 = puVar12 + iVar14;
                  } while (puVar11 < puVar24);
                }
              }
              else if (iVar8 != 0x1f) {
                bVar6 = (byte)(uVar20 - 6);
                bVar7 = (byte)(iVar16 + -6);
                uVar10 = 1 << (bVar7 & 0x1f);
                iVar14 = 2 << (bVar6 & 0x1f);
                uVar21 = 1;
                if (1 < (int)uVar10) {
                  uVar21 = (ulong)uVar10;
                }
                lVar22 = (long)(2 << (bVar7 & 0x1f));
                lVar17 = (long)(1 << (bVar6 & 0x1f));
                puVar12 = local_1038 + lVar17;
                puVar23 = local_1038 + (int)uVar10;
                puVar11 = local_1038;
                do {
                  if (uVar20 - 6 != 0x1f) {
                    lVar15 = 0;
                    puVar13 = puVar12;
                    puVar19 = puVar23;
                    do {
                      if (iVar16 + -6 != 0x1f) {
                        uVar9 = 0;
                        do {
                          uVar25 = puVar19[uVar9];
                          puVar19[uVar9] = puVar13[uVar9];
                          puVar13[uVar9] = uVar25;
                          uVar9 = uVar9 + 1;
                        } while (uVar21 != uVar9);
                      }
                      lVar15 = lVar15 + lVar22;
                      puVar13 = puVar13 + lVar22;
                      puVar19 = puVar19 + lVar22;
                    } while (lVar15 < lVar17);
                  }
                  puVar11 = puVar11 + iVar14;
                  puVar12 = puVar12 + iVar14;
                  puVar23 = puVar23 + iVar14;
                } while (puVar11 < puVar24);
              }
            }
            local_10b0 = (ulong)(iVar16 + 1);
          }
        }
        else if (uVar20 < 6) {
          if (iVar8 != 0x1f) {
            uVar21 = 0;
            do {
              if (((local_1038[uVar21] >> ((byte)(1 << (bVar6 & 0x1f)) & 0x3f) ^ local_1038[uVar21])
                  & s_Truths6Neg[uVar20]) != 0) goto LAB_00414663;
              uVar21 = uVar21 + 1;
            } while (uVar4 != uVar21);
          }
        }
        else if (iVar8 != 0x1f) {
          bVar7 = (byte)(uVar20 - 6);
          uVar10 = 1 << (bVar7 & 0x1f);
          iVar16 = 2 << (bVar7 & 0x1f);
          uVar21 = 1;
          if (1 < (int)uVar10) {
            uVar21 = (ulong)uVar10;
          }
          puVar12 = local_1038 + (int)uVar10;
          puVar11 = local_1038;
          do {
            if (uVar20 - 6 != 0x1f) {
              uVar9 = 0;
              do {
                if (puVar11[uVar9] != puVar12[uVar9]) goto LAB_00414663;
                uVar9 = uVar9 + 1;
              } while (uVar21 != uVar9);
            }
            puVar11 = puVar11 + iVar16;
            puVar12 = puVar12 + iVar16;
          } while (puVar11 < puVar24);
        }
        uVar20 = uVar20 + 1;
      } while (uVar20 != (uint)nLeaves);
    }
    if (nLeaves < (int)local_10b0) {
      __assert_fail("k < nVars",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/utilTruth.h"
                    ,0x769,"int Abc_TtMinBase(word *, int *, int, int)");
    }
  }
  sVar5 = strlen(pStr);
  iVar16 = (int)sVar5;
  if (iVar16 - 4U < 0xfffffffe) {
    uVar4 = 0;
    printf("Wrong LUT struct (%s)\n",pStr);
  }
  else {
    uVar20 = 0;
    do {
      if ((byte)(pStr[uVar20] - 0x37U) < 0xfc) {
        printf("The LUT size (%d) should belong to {3,4,5,6}.\n",(ulong)((int)pStr[uVar20] - 0x30));
        return 0;
      }
      uVar20 = uVar20 + 1;
    } while ((sVar5 & 0xffffffff) != uVar20);
    iVar8 = 0;
    if (iVar16 == 3) {
      iVar8 = pStr[1] + -0x30;
    }
    iVar14 = iVar8 + -1;
    if (iVar8 == 0) {
      iVar14 = 0;
    }
    nVars_00 = (int)local_10b0;
    if ((int)pStr[iVar16 - 1] + iVar14 + *pStr + -0x61 < nVars_00) {
      uVar4 = 0;
      printf("The cut size (%d) is too large for the LUT structure %s.\n",local_10b0,pStr);
    }
    else {
      nLutLeaf = *pStr + -0x30;
      nLutRoot = pStr[iVar16 - 1] + -0x30;
      iVar14 = nLutRoot;
      if (nLutRoot < nLutLeaf) {
        iVar14 = nLutLeaf;
      }
      if (iVar14 < iVar8) {
        iVar14 = iVar8;
      }
      uVar4 = 1;
      if (iVar14 < nVars_00) {
        if (iVar16 == 2) {
          If_CluCheck(&local_104a,p,local_1038,nVars_00,0,0,nLutLeaf,nLutRoot,(If_Grp_t *)0x0,
                      (word *)0x0,(word *)0x0,(word *)0x0,1);
        }
        else {
          If_CluCheck3(&local_104a,p,local_1038,nVars_00,nLutLeaf,iVar8,nLutRoot,(If_Grp_t *)0x0,
                       (If_Grp_t *)0x0,(word *)0x0,(word *)0x0,(word *)0x0);
        }
        uVar4 = (uint)('\0' < local_104a.nVars);
      }
    }
  }
  return uVar4;
}

Assistant:

int If_CutPerformCheck16( If_Man_t * p, unsigned * pTruth0, int nVars, int nLeaves, char * pStr )
{
    unsigned pTruth[IF_MAX_FUNC_LUTSIZE > 5 ? 1 << (IF_MAX_FUNC_LUTSIZE - 5) : 1];
    If_Grp_t G1 = {0};//, G3 = {0};
    int i, nLutLeaf, nLutLeaf2, nLutRoot, Length;
    // stretch the truth table
    assert( nVars >= 6 );
    memcpy( pTruth, pTruth0, sizeof(word) * Abc_TtWordNum(nVars) );
    Abc_TtStretch6( (word *)pTruth, nLeaves, p->pPars->nLutSize );

#ifdef IF_TRY_NEW
    {
        word pCopy[1024];
        int nWords = Abc_TruthWordNum(nVars);
        int iNum;
        if ( s_vTtMem == NULL )
        {
            s_vTtMem = Vec_MemAlloc( Abc_Truth6WordNum(nVars), 12 ); // 32 KB/page for 6-var functions
            Vec_MemHashAlloc( s_vTtMem, 10000 );
        }
        if ( s_vTtMem2 == NULL )
        {
            s_vTtMem2 = Vec_MemAlloc( Abc_Truth6WordNum(nVars), 12 ); // 32 KB/page for 6-var functions
            Vec_MemHashAlloc( s_vTtMem2, 10000 );
        }
        memcpy( pCopy, pTruth, sizeof(word) * Abc_Truth6WordNum(nVars) );
        if ( pCopy[0] & 1 )
            for ( i = 0; i < nWords; i++ )
                pCopy[i] = ~pCopy[i];
        iNum = Vec_MemHashInsert( s_vTtMem, pCopy );
        if ( iNum == Vec_MemEntryNum(s_vTtMem) - 1 )
        {
            int pCanonPerm[16];
            char pCanonPermC[16];
            Abc_TtCanonicize( pCopy, nVars, pCanonPermC );
//            If_CluSemiCanonicize( pCopy, nVars, pCanonPerm );
            Vec_MemHashInsert( s_vTtMem2, pCopy );
        }
    }
#endif

    // if cutmin is disabled, minimize the function
    if ( !p->pPars->fCutMin )
        nLeaves = Abc_TtMinBase( (word *)pTruth, NULL, nLeaves, nVars );

    // quit if parameters are wrong
    Length = strlen(pStr);
    if ( Length != 2 && Length != 3 )
    {
        printf( "Wrong LUT struct (%s)\n", pStr );
        return 0;
    }
    for ( i = 0; i < Length; i++ )
        if ( pStr[i] - '0' < 3 || pStr[i] - '0' > 6 )
        {
            printf( "The LUT size (%d) should belong to {3,4,5,6}.\n", pStr[i] - '0' );
            return 0;
        }

    nLutLeaf  =                   pStr[0] - '0';
    nLutLeaf2 = ( Length == 3 ) ? pStr[1] - '0' : 0;
    nLutRoot  =                   pStr[Length-1] - '0';
    if ( nLeaves > nLutLeaf - 1 + (nLutLeaf2 ? nLutLeaf2 - 1 : 0) + nLutRoot )
    {
        printf( "The cut size (%d) is too large for the LUT structure %s.\n", nLeaves, pStr );
        return 0;
    }
    // consider easy case
    if ( nLeaves <= Abc_MaxInt( nLutLeaf2, Abc_MaxInt(nLutLeaf, nLutRoot) ) )
        return 1;

    // derive the first group
    if ( Length == 2 )
        G1 = If_CluCheck( p, (word *)pTruth, nLeaves, 0, 0, nLutLeaf, nLutRoot, NULL, NULL, NULL, NULL, 1 );
    else
        G1 = If_CluCheck3( p, (word *)pTruth, nLeaves, nLutLeaf, nLutLeaf2, nLutRoot, NULL, NULL, NULL, NULL, NULL );

//    if ( G1.nVars > 0 )
//        If_CluPrintGroup( &G1 );

    return (int)(G1.nVars > 0);
}